

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

FinalizableObject * __thiscall
TTD::ThreadContextTTD::GetRuntimeContextForScriptContext(ThreadContextTTD *this,ScriptContext *ctx)

{
  FinalizableObject **ppFVar1;
  ScriptContext *local_18;
  ScriptContext *ctx_local;
  
  ctx_local = (ScriptContext *)0x0;
  local_18 = ctx;
  ppFVar1 = JsUtil::
            BaseDictionary<Js::ScriptContext*,FinalizableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::LookupWithKey<Js::ScriptContext*>
                      ((BaseDictionary<Js::ScriptContext*,FinalizableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->m_ttdContextToExternalRefMap,&local_18,
                       (FinalizableObject **)&ctx_local);
  return *ppFVar1;
}

Assistant:

FinalizableObject* ThreadContextTTD::GetRuntimeContextForScriptContext(Js::ScriptContext* ctx)
    {
        return this->m_ttdContextToExternalRefMap.Lookup(ctx, nullptr);
    }